

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
hta::storage::file::Directory::metric_names_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Directory *this)

{
  size_type sVar1;
  pointer pbVar2;
  pointer pbVar3;
  char cVar4;
  path *__p;
  long lVar5;
  ulong uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  directory_iterator local_68;
  directory_iterator local_58;
  path local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_58,&this->directory_,none,(error_code *)0x0);
  if (local_58._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_58._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_58._M_dir._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_68._M_dir._M_ptr = local_58._M_dir._M_ptr;
  local_68._M_dir._M_refcount._M_pi = local_58._M_dir._M_refcount._M_pi;
  if (local_58._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_58._M_dir._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58._M_dir._M_refcount._M_pi)->_M_use_count =
           (local_58._M_dir._M_refcount._M_pi)->_M_use_count + 1;
    }
    if (local_58._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_dir._M_refcount._M_pi);
    }
  }
  do {
    if (local_68._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (local_58._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_dir._M_refcount._M_pi
                  );
      }
      pbVar2 = (__return_storage_ptr__->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (__return_storage_ptr__->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar2 != pbVar3) {
        uVar6 = (long)pbVar3 - (long)pbVar2 >> 5;
        lVar5 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pbVar2,pbVar3,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pbVar2,pbVar3);
      }
      return __return_storage_ptr__;
    }
    __p = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_68);
    cVar4 = std::filesystem::status(__p);
    if (cVar4 == '\x02') {
      sVar1 = (__p->_M_pathname)._M_string_length;
      if (sVar1 == 0) {
LAB_0016daca:
        std::filesystem::__cxx11::path::path((path *)&local_48);
      }
      else {
        uVar6 = *(ulong *)&__p->_M_cmpts;
        if ((~(byte)uVar6 & 3) != 0) {
          if (((uVar6 & 3) == 0) && ((__p->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/')) {
            if ((uVar6 & 3) == 0) {
              lVar5 = std::filesystem::__cxx11::path::_List::end();
            }
            else {
              lVar5 = 0;
            }
            if (((byte)__p->_M_cmpts & 3) == 0) {
              __p = (path *)(lVar5 + -0x30);
            }
            if ((~*(uint *)&__p->_M_cmpts & 3) == 0) goto LAB_0016dabd;
          }
          goto LAB_0016daca;
        }
LAB_0016dabd:
        Catch::clara::std::filesystem::__cxx11::path::path(&local_48,(path *)__p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<std::filesystem::__cxx11::path>(__return_storage_ptr__,(path *)&local_48);
      Catch::clara::std::filesystem::__cxx11::path::~path(&local_48);
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_68);
  } while( true );
}

Assistant:

std::vector<std::string> Directory::metric_names()
{
    std::vector<std::string> result;
    for (const std::filesystem::path& path : std::filesystem::directory_iterator(directory_))
    {
        if (std::filesystem::is_directory(path))
        {
            result.emplace_back(path.filename());
        }
    }
    std::sort(result.begin(), result.end());
    return result;
}